

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O1

void __thiscall
notch::core::FullyConnectedLayer::rememberInputs(FullyConnectedLayer *this,Array *inputs)

{
  element_type *peVar1;
  size_t sVar2;
  float *__dest;
  float *__src;
  
  peVar1 = (this->super_ABackpropLayer).shared.inputBuffer.
           super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  sVar2 = peVar1->_M_size;
  if (sVar2 == inputs->_M_size) {
    if (sVar2 == 0) {
      return;
    }
    __dest = peVar1->_M_data;
    __src = inputs->_M_data;
  }
  else {
    if (peVar1->_M_data != (float *)0x0) {
      operator_delete(peVar1->_M_data);
    }
    sVar2 = inputs->_M_size;
    peVar1->_M_size = sVar2;
    __dest = (float *)operator_new(sVar2 << 2);
    peVar1->_M_data = __dest;
    __src = inputs->_M_data;
    if (__src == (float *)0x0) {
      return;
    }
    sVar2 = peVar1->_M_size;
  }
  memcpy(__dest,__src,sVar2 << 2);
  return;
}

Assistant:

void rememberInputs(const Array& inputs) {
        *(shared.inputBuffer) = inputs;  // remember for calcSensitivityFactors()
    }